

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void boost::notify_all_at_thread_exit(condition_variable *cond,unique_lock<boost::mutex> *lk)

{
  mutex *pmVar1;
  thread_data_base *ptVar2;
  
  ptVar2 = detail::get_current_thread_data();
  if (ptVar2 != (thread_data_base *)0x0) {
    pmVar1 = lk->m;
    lk->m = (mutex *)0x0;
    lk->is_locked = false;
    (*ptVar2->_vptr_thread_data_base[3])(ptVar2,cond,pmVar1,ptVar2->_vptr_thread_data_base[3]);
    return;
  }
  return;
}

Assistant:

BOOST_THREAD_DECL void notify_all_at_thread_exit(condition_variable& cond, unique_lock<mutex> lk)
    {
      detail::thread_data_base* const current_thread_data(detail::get_current_thread_data());
      if(current_thread_data)
      {
        current_thread_data->notify_all_at_thread_exit(&cond, lk.release());
      }
    }